

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenerator::MessagePath_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenerator *this,string_view path)

{
  string_view str;
  string_view str_00;
  bool bVar1;
  ProjectDirsT *pPVar2;
  char *pcVar3;
  size_type sVar4;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  undefined1 auVar6 [16];
  allocator<char> local_119;
  string local_118 [32];
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  string local_e8;
  string_view local_c8;
  cmQtAutoGenerator *local_b8;
  char *pcStack_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98;
  string_view local_68;
  cmQtAutoGenerator *local_58;
  char *pcStack_50;
  string local_48 [8];
  string res;
  cmQtAutoGenerator *this_local;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  this_local = (cmQtAutoGenerator *)path._M_len;
  res.field_2._8_8_ = this;
  path_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string(local_48);
  local_58 = this_local;
  pcStack_50 = (char *)path_local._M_len;
  pPVar2 = ProjectDirs(this);
  local_68 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pPVar2)
  ;
  str_00._M_str = pcStack_50;
  str_00._M_len = (size_t)local_58;
  bVar1 = cmHasPrefix(str_00,local_68);
  if (bVar1) {
    ProjectDirs(this);
    sVar4 = std::__cxx11::string::size();
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,sVar4,
                       0xffffffffffffffff);
    local_a8._M_str = bVar5._M_str;
    pcVar3 = (char *)bVar5._M_len;
    local_a8._M_len = (size_t)pcVar3;
    cmStrCat<char_const(&)[5],std::basic_string_view<char,std::char_traits<char>>>
              (&local_98,(char (*) [5])"SRC:",&local_a8);
    std::__cxx11::string::operator=(local_48,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    local_b8 = this_local;
    pcStack_b0 = (char *)path_local._M_len;
    pPVar2 = ProjectDirs(this);
    local_c8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pPVar2->Binary);
    pcVar3 = local_c8._M_str;
    str._M_str = pcStack_b0;
    str._M_len = (size_t)local_b8;
    bVar1 = cmHasPrefix(str,local_c8);
    if (bVar1) {
      ProjectDirs(this);
      sVar4 = std::__cxx11::string::size();
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,sVar4,
                         0xffffffffffffffff);
      local_f8._M_str = bVar5._M_str;
      pcVar3 = (char *)bVar5._M_len;
      local_f8._M_len = (size_t)pcVar3;
      cmStrCat<char_const(&)[5],std::basic_string_view<char,std::char_traits<char>>>
                (&local_e8,(char (*) [5])"BIN:",&local_f8);
      std::__cxx11::string::operator=(local_48,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_118,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 &local_119);
      std::__cxx11::string::operator=(local_48,local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
    }
  }
  auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  text._M_len = auVar6._8_8_;
  text._M_str = pcVar3;
  cmQtAutoGen::Quoted_abi_cxx11_(__return_storage_ptr__,auVar6._0_8_,text);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::MessagePath(cm::string_view path) const
{
  std::string res;
  if (cmHasPrefix(path, this->ProjectDirs().Source)) {
    res = cmStrCat("SRC:", path.substr(this->ProjectDirs().Source.size()));
  } else if (cmHasPrefix(path, this->ProjectDirs().Binary)) {
    res = cmStrCat("BIN:", path.substr(this->ProjectDirs().Binary.size()));
  } else {
    res = std::string(path);
  }
  return cmQtAutoGen::Quoted(res);
}